

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O0

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CNegativeExpression *exp)

{
  bool bVar1;
  pointer pIVar2;
  CNegativeExpression *exp_local;
  CConvertVisitor *this_local;
  
  std::__cxx11::string::operator+=((string *)&this->code,"!(");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&exp->expression);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&exp->expression);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  }
  std::__cxx11::string::operator+=((string *)&this->code,")");
  return;
}

Assistant:

void CConvertVisitor::Visit(CNegativeExpression &exp) {
	this->code += "!(";
	if (exp.expression) {
		exp.expression->Accept(*this);
	}
	this->code += ")";
}